

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.cpp
# Opt level: O3

void test<long>(long expected,string *value)

{
  char cVar1;
  size_type sVar2;
  bool bVar3;
  char *pcVar4;
  long lVar5;
  size_type sVar6;
  byte bVar7;
  char *pcVar8;
  undefined1 in_R9B;
  undefined7 in_register_00000089;
  long result2;
  AssertionResult gtest_ar;
  long result;
  AssertHelper local_60;
  AssertHelper local_58;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_50;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_48;
  string local_40;
  long local_20;
  long local_18;
  
  sVar2 = value->_M_string_length;
  local_18 = expected;
  if (sVar2 == 0) {
LAB_0011f24a:
    local_20 = 0;
LAB_0011f186:
    local_50.ptr_ =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
         ((ulong)local_50.ptr_._1_7_ << 8);
    local_48.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    testing::Message::Message((Message *)&local_60);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_40,(internal *)&local_50,(AssertionResult *)0x1424ac,"false","true",
               (char *)CONCAT71(in_register_00000089,in_R9B));
    testing::internal::AssertHelper::AssertHelper
              (&local_58,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/jsteemann[P]atoi/tests/tests.cpp",
               0x18,(char *)CONCAT71(local_40._M_dataplus._M_p._1_7_,(char)local_40._M_dataplus._M_p
                                    ));
    testing::internal::AssertHelper::operator=(&local_58,(Message *)&local_60);
    testing::internal::AssertHelper::~AssertHelper(&local_58);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_40._M_dataplus._M_p._1_7_,(char)local_40._M_dataplus._M_p) !=
        &local_40.field_2) {
      operator_delete((undefined1 *)
                      CONCAT71(local_40._M_dataplus._M_p._1_7_,(char)local_40._M_dataplus._M_p));
    }
    if (((local_60.data_ != (AssertHelperData *)0x0) &&
        (bVar3 = testing::internal::IsTrue(true), bVar3)) &&
       (local_60.data_ != (AssertHelperData *)0x0)) {
      (**(code **)(*(long *)local_60.data_ + 8))();
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_48,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    return;
  }
  pcVar4 = (value->_M_dataplus)._M_p;
  pcVar8 = pcVar4 + sVar2;
  if (*pcVar4 == '-') {
    if (sVar2 == 1) goto LAB_0011f24a;
    pcVar4 = pcVar4 + 1;
    lVar5 = 0;
    do {
      local_20 = lVar5;
      if ((byte)(*pcVar4 - 0x3aU) < 0xf6) goto LAB_0011f186;
      bVar7 = *pcVar4 - 0x30;
      if ((lVar5 < -0xccccccccccccccc) ||
         (in_R9B = 8 < bVar7, local_20 = -0xccccccccccccccc,
         lVar5 == -0xccccccccccccccc && (bool)in_R9B)) goto LAB_0011f186;
      lVar5 = lVar5 * 10 - (ulong)bVar7;
      pcVar4 = pcVar4 + 1;
    } while (pcVar4 < pcVar8);
  }
  else {
    if (*pcVar4 == '+') {
      pcVar4 = pcVar4 + 1;
    }
    if (pcVar4 == pcVar8) goto LAB_0011f24a;
    lVar5 = 0;
    do {
      local_20 = lVar5;
      if ((byte)(*pcVar4 - 0x3aU) < 0xf6) goto LAB_0011f186;
      bVar7 = *pcVar4 - 0x30;
      if ((0xccccccccccccccc < lVar5) ||
         (in_R9B = 7 < bVar7, local_20 = 0xccccccccccccccc,
         lVar5 == 0xccccccccccccccc && (bool)in_R9B)) goto LAB_0011f186;
      lVar5 = (ulong)bVar7 + lVar5 * 10;
      pcVar4 = pcVar4 + 1;
    } while (pcVar4 < pcVar8);
  }
  local_50.ptr_._0_1_ = 1;
  local_48.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_20 = lVar5;
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_48,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  testing::internal::CmpHelperEQ<long,long>
            ((internal *)&local_40,"expected","result",&local_18,&local_20);
  if ((char)local_40._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_50);
    if ((undefined8 *)local_40._M_string_length == (undefined8 *)0x0) {
      pcVar8 = "";
    }
    else {
      pcVar8 = *(char **)local_40._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_60,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/jsteemann[P]atoi/tests/tests.cpp",
               0x19,pcVar8);
    testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_50);
    testing::internal::AssertHelper::~AssertHelper(&local_60);
    if (((local_50.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
        (bVar3 = testing::internal::IsTrue(true), bVar3)) &&
       (local_50.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
      (**(code **)(*(long *)local_50.ptr_ + 8))();
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&local_40._M_string_length,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    return;
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_40._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  sVar2 = value->_M_string_length;
  if (sVar2 != 0) {
    pcVar8 = (value->_M_dataplus)._M_p;
    if (*pcVar8 == '-') {
      if (sVar2 != 1) {
        sVar6 = 1;
        local_50.ptr_ =
             (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        do {
          local_50.ptr_ =
               (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
               (((long)local_50.ptr_ * 10 - (long)pcVar8[sVar6]) + 0x30);
          sVar6 = sVar6 + 1;
        } while (sVar2 != sVar6);
        goto LAB_0011f055;
      }
    }
    else {
      pcVar4 = pcVar8 + sVar2;
      if (*pcVar8 == '+') {
        pcVar8 = pcVar8 + 1;
      }
      if (pcVar8 != pcVar4) {
        local_50.ptr_ =
             (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        do {
          cVar1 = *pcVar8;
          pcVar8 = pcVar8 + 1;
          local_50.ptr_ =
               (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ((long)cVar1 + (long)local_50.ptr_ * 10 + -0x30);
        } while (pcVar8 != pcVar4);
        goto LAB_0011f055;
      }
    }
  }
  local_50.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
LAB_0011f055:
  testing::internal::CmpHelperEQ<long,long>
            ((internal *)&local_40,"expected","result2",&local_18,(long *)&local_50);
  if ((char)local_40._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_60);
    if ((undefined8 *)local_40._M_string_length == (undefined8 *)0x0) {
      pcVar8 = "";
    }
    else {
      pcVar8 = *(char **)local_40._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_58,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/jsteemann[P]atoi/tests/tests.cpp",
               0x1c,pcVar8);
    testing::internal::AssertHelper::operator=(&local_58,(Message *)&local_60);
    testing::internal::AssertHelper::~AssertHelper(&local_58);
    if (((local_60.data_ != (AssertHelperData *)0x0) &&
        (bVar3 = testing::internal::IsTrue(true), bVar3)) &&
       (local_60.data_ != (AssertHelperData *)0x0)) {
      (**(code **)(*(long *)local_60.data_ + 8))();
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_40._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  return;
}

Assistant:

static void test(T expected, std::string const& value) {
  bool valid;
  T result = jsteemann::atoi<T>(value.c_str(), value.c_str() + value.size(), valid);
  ASSERT_TRUE(valid);
  ASSERT_EQ(expected, result);
  
  T result2 = jsteemann::atoi_unchecked<T>(value.c_str(), value.c_str() + value.size());
  ASSERT_EQ(expected, result2);
}